

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# whisper.cpp
# Opt level: O0

size_t whisper_sched_size(whisper_sched *allocr)

{
  int iVar1;
  undefined8 uVar2;
  long lVar3;
  undefined8 *in_RDI;
  ggml_backend_t backend;
  int i;
  size_t size;
  int local_14;
  size_type local_10;
  
  local_10 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                       ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)(in_RDI + 1));
  local_14 = 0;
  while( true ) {
    iVar1 = ggml_backend_sched_get_n_backends(*in_RDI);
    if (iVar1 <= local_14) break;
    uVar2 = ggml_backend_sched_get_backend(*in_RDI,local_14);
    lVar3 = ggml_backend_sched_get_buffer_size(*in_RDI,uVar2);
    local_10 = lVar3 + local_10;
    local_14 = local_14 + 1;
  }
  return local_10;
}

Assistant:

static size_t whisper_sched_size(struct whisper_sched & allocr) {
    size_t size = allocr.meta.size();
    for (int i = 0; i < ggml_backend_sched_get_n_backends(allocr.sched); ++i) {
        ggml_backend_t backend = ggml_backend_sched_get_backend(allocr.sched, i);
        size += ggml_backend_sched_get_buffer_size(allocr.sched, backend);
    }
    return size;
}